

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

xpath_ast_node * __thiscall pugi::impl::anon_unknown_0::xpath_parser::parse(xpath_parser *this)

{
  lexeme_t lVar1;
  xpath_ast_node *n;
  xpath_parser *this_local;
  
  this_local = (xpath_parser *)parse_expression(this,0);
  if (this_local == (xpath_parser *)0x0) {
    this_local = (xpath_parser *)0x0;
  }
  else {
    lVar1 = xpath_lexer::current(&this->_lexer);
    if (lVar1 != lex_eof) {
      this_local = (xpath_parser *)error(this,"Incorrect query");
    }
  }
  return (xpath_ast_node *)this_local;
}

Assistant:

xpath_ast_node* parse()
		{
			xpath_ast_node* n = parse_expression();
			if (!n) return 0;

			// check if there are unparsed tokens left
			if (_lexer.current() != lex_eof)
				return error("Incorrect query");

			return n;
		}